

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# take_at_most.hpp
# Opt level: O0

iterator_range<burst::take_at_most_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_long>_>
* __thiscall
burst::detail::
take_at_most_impl<std::istream_iterator<int,char,std::char_traits<char>,long>,long,std::input_iterator_tag>
          (iterator_range<burst::take_at_most_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_long>_>
           *__return_storage_ptr__,detail *this,
          istream_iterator<int,_char,_std::char_traits<char>,_long> *first,long last,long n)

{
  take_at_most_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_long> *End;
  take_at_most_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_long>
  local_f8;
  take_at_most_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_long>
  local_d0;
  undefined1 local_a0 [8];
  take_at_most_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_long> end;
  istream_iterator<int,_char,_std::char_traits<char>,_long> local_68;
  undefined1 local_58 [8];
  take_at_most_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_long> begin;
  long n_local;
  istream_iterator<int,_char,_std::char_traits<char>,_long> *last_local;
  istream_iterator<int,_char,_std::char_traits<char>,_long> *first_local;
  
  begin.m_remaining = last;
  std::istream_iterator<int,_char,_std::char_traits<char>,_long>::istream_iterator
            (&local_68,(istream_iterator<int,_char,_std::char_traits<char>,_long> *)this);
  std::istream_iterator<int,_char,_std::char_traits<char>,_long>::istream_iterator
            ((istream_iterator<int,_char,_std::char_traits<char>,_long> *)&end.m_remaining,first);
  End = (take_at_most_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_long>
         *)begin.m_remaining;
  make_take_at_most_iterator<std::istream_iterator<int,char,std::char_traits<char>,long>,long>
            ((take_at_most_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_long>
              *)local_58,(burst *)&local_68,
             (istream_iterator<int,_char,_std::char_traits<char>,_long> *)&end.m_remaining,
             (istream_iterator<int,_char,_std::char_traits<char>,_long> *)begin.m_remaining,n);
  make_take_at_most_iterator<std::istream_iterator<int,char,std::char_traits<char>,long>,long>
            (local_a0,(burst *)local_58);
  take_at_most_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_long>::
  take_at_most_iterator
            (&local_d0,
             (take_at_most_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_long>
              *)local_58);
  take_at_most_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_long>::
  take_at_most_iterator
            (&local_f8,
             (take_at_most_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_long>
              *)local_a0);
  boost::
  make_iterator_range<burst::take_at_most_iterator<std::istream_iterator<int,char,std::char_traits<char>,long>,long>>
            (__return_storage_ptr__,(boost *)&local_d0,&local_f8,End);
  return __return_storage_ptr__;
}

Assistant:

auto take_at_most_impl (Iterator first, Iterator last, Integer n, Category)
        {
            auto begin = burst::make_take_at_most_iterator(first, last, n);
            auto end = burst::make_take_at_most_iterator(iterator::end_tag, begin);

            return boost::make_iterator_range(std::move(begin), std::move(end));
        }